

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O0

LispPTR cdr(LispPTR datum)

{
  ushort uVar1;
  LispPTR *pLVar2;
  ConsCell *temp;
  DLword cdr_code;
  ConsCell *datum68k;
  LispPTR datum_local;
  
  if (datum == 0) {
    datum68k._4_4_ = 0;
  }
  else {
    if ((*(ushort *)((ulong)(MDStypetbl + (datum >> 9)) ^ 2) & 0x7ff) != 5) {
      error("cdr : ARG not list");
    }
    pLVar2 = NativeAligned4FromLAddr(datum);
    uVar1 = (ushort)(*pLVar2 >> 0x1c);
    if (uVar1 == 8) {
      datum68k._4_4_ = 0;
    }
    else if ((uVar1 & 8) == 0) {
      if (uVar1 == 0) {
        datum68k._4_4_ = cdr(*pLVar2 & 0xfffffff);
      }
      else {
        pLVar2 = NativeAligned4FromLAddr(datum + (uint)uVar1 * 2);
        datum68k._4_4_ = *pLVar2 & 0xfffffff;
      }
    }
    else {
      datum68k._4_4_ = datum + (uVar1 & 7) * 2;
    }
  }
  return datum68k._4_4_;
}

Assistant:

LispPTR cdr(LispPTR datum)
/* datum must be LISP pointer(word offset) */
{
  ConsCell *datum68k;
  DLword cdr_code;
  ConsCell *temp;

  if (datum == NIL_PTR) return (NIL_PTR);
  if (!Listp(datum)) error("cdr : ARG not list");

  datum68k = (ConsCell *)(NativeAligned4FromLAddr(datum));
  cdr_code = datum68k->cdr_code;

  if (cdr_code == CDR_NIL) return (NIL_PTR); /* cdr is nil */
  if ((cdr_code & CDR_ONPAGE) != 0) /* cdr-samepage */
#ifdef NEWCDRCODING
    return (datum + ((cdr_code & 7) << 1));
#else
    return (POINTER_PAGEBASE(datum) + ((cdr_code & 127) << 1));
#endif                                 /* NEWCDRCODING */
  if (cdr_code == CDR_INDIRECT) /* cdr_code > CDR_ONPAGE cdr-indirect */
    return (cdr((LispPTR)(datum68k->car_field)));
  /* cdr isn't a CONS, but is stored on this page. */
#ifdef NEWCDRCODING
  temp = (ConsCell *)(NativeAligned4FromLAddr(datum + (cdr_code << 1)));
#else
  temp = (ConsCell *)(NativeAligned4FromLAddr(POINTER_PAGEBASE(datum) + (cdr_code << 1)));
#endif /* NEWCDRCODING */
  return ((LispPTR)temp->car_field);
}